

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol_post_demo.c
# Opt level: O2

int format_result(per_session_data__post_demo *pss)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  size_t size;
  char **ppcVar7;
  int local_40;
  
  iVar2 = lws_snprintf(pss->result + 0x10,0x7ff,
                       "<!DOCTYPE html><html lang=\"en\"><head><meta charset=utf-8 http-equiv=\"Content-Language\" content=\"en\"/><title>LWS Server Status</title></head><body><h1>Form results (after urldecoding)</h1><table><tr><td>Name</td><td>Length</td><td>Value</td></tr>"
                      );
  pcVar6 = pss->result + (long)iVar2 + 0x10;
  ppcVar7 = param_names;
  for (lVar5 = 0; lVar5 != 4; lVar5 = lVar5 + 1) {
    iVar2 = (int)lVar5;
    pcVar4 = lws_spa_get_string(pss->spa,iVar2);
    size = (long)pss + (0x817 - (long)pcVar6);
    pcVar1 = *ppcVar7;
    if (pcVar4 == (char *)0x0) {
      iVar2 = lws_snprintf(pcVar6,size,"<tr><td><b>%s</b></td><td>0</td><td>NULL</td></tr>",pcVar1);
    }
    else {
      uVar3 = lws_spa_get_length(pss->spa,iVar2);
      pcVar4 = lws_spa_get_string(pss->spa,iVar2);
      iVar2 = lws_snprintf(pcVar6,size,"<tr><td><b>%s</b></td><td>%d</td><td>%s</td></tr>",pcVar1,
                           (ulong)uVar3,pcVar4);
    }
    pcVar6 = pcVar6 + iVar2;
    ppcVar7 = ppcVar7 + 1;
  }
  iVar2 = lws_snprintf(pcVar6,(long)pss + (0x817 - (long)pcVar6),
                       "</table><br><b>filename:</b> %s, <b>length</b> %ld",pss->filename,
                       pss->file_length);
  pcVar6 = pcVar6 + iVar2;
  iVar2 = lws_snprintf(pcVar6,(long)pss + (0x817 - (long)pcVar6),"</body></html>");
  local_40 = (int)(pss->result + 0x10);
  return (iVar2 + (int)pcVar6) - local_40;
}

Assistant:

static int
format_result(struct per_session_data__post_demo *pss)
{
	unsigned char *p, *start, *end;
	int n;

	p = (unsigned char *)pss->result + LWS_PRE;
	start = p;
	end = p + sizeof(pss->result) - LWS_PRE - 1;

	p += lws_snprintf((char *)p, end -p,
			"<!DOCTYPE html><html lang=\"en\"><head>"
			"<meta charset=utf-8 http-equiv=\"Content-Language\" "
			"content=\"en\"/>"
	  "<title>LWS Server Status</title>"
	  "</head><body><h1>Form results (after urldecoding)</h1>"
	  "<table><tr><td>Name</td><td>Length</td><td>Value</td></tr>");

	for (n = 0; n < (int)LWS_ARRAY_SIZE(param_names); n++) {
		if (!lws_spa_get_string(pss->spa, n))
			p += lws_snprintf((char *)p, end - p,
			    "<tr><td><b>%s</b></td><td>0"
			    "</td><td>NULL</td></tr>",
			    param_names[n]);
		else
			p += lws_snprintf((char *)p, end - p,
			    "<tr><td><b>%s</b></td><td>%d"
			    "</td><td>%s</td></tr>",
			    param_names[n],
			    lws_spa_get_length(pss->spa, n),
			    lws_spa_get_string(pss->spa, n));
	}

	p += lws_snprintf((char *)p, end - p,
			"</table><br><b>filename:</b> %s, "
			"<b>length</b> %ld",
			pss->filename, pss->file_length);

	p += lws_snprintf((char *)p, end - p, "</body></html>");

	return (int)lws_ptr_diff(p, start);
}